

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toggle.cpp
# Opt level: O3

bool __thiscall ftxui::anon_unknown_3::ToggleBase::OnEvent(ToggleBase *this,Event *event)

{
  pointer pcVar1;
  Ref<int> *pRVar2;
  ComponentBase *pCVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ToggleOption *pTVar8;
  Ref<int> *pRVar9;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *pvVar10;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *pvVar11;
  ToggleOption *pTVar12;
  pointer *__ptr;
  int *piVar13;
  pointer pBVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  Event local_b8;
  Type local_78;
  Button BStack_74;
  Motion MStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  long *local_60 [2];
  long local_50 [2];
  ScreenInteractive *local_40;
  
  if (event->type_ == Mouse) {
    local_68 = *(undefined8 *)((long)&event->field_1 + 0xc);
    local_78 = event->type_;
    BStack_74 = (event->field_1).mouse_.button;
    MStack_70 = (event->field_1).mouse_.motion;
    uStack_6c = *(undefined4 *)((long)&event->field_1 + 8);
    pcVar1 = (event->input_)._M_dataplus._M_p;
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_60,pcVar1,pcVar1 + (event->input_)._M_string_length);
    local_40 = event->screen_;
    ComponentBase::CaptureMouse((ComponentBase *)&local_b8,(Event *)this);
    if ((_func_int **)local_b8._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_b8._0_8_ + 8))();
      pBVar14 = (this->boxes_).super__Vector_base<ftxui::Box,_std::allocator<ftxui::Box>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(this->boxes_).
                                  super__Vector_base<ftxui::Box,_std::allocator<ftxui::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)pBVar14) >> 4))
      {
        lVar18 = 0;
        lVar17 = 0;
        do {
          bVar5 = Box::Contain((Box *)((long)&pBVar14->x_min + lVar18),(int)local_68,local_68._4_4_)
          ;
          if (bVar5) {
            ComponentBase::TakeFocus(&this->super_ComponentBase);
            pTVar8 = (this->option_).address_;
            if (pTVar8 == (ToggleOption *)0x0) {
              pTVar8 = &(this->option_).owned_;
            }
            pRVar2 = (Ref<int> *)(pTVar8->focused_entry).address_;
            pRVar9 = &pTVar8->focused_entry;
            if (pRVar2 != (Ref<int> *)0x0) {
              pRVar9 = pRVar2;
            }
            iVar16 = (int)lVar17;
            pRVar9->owned_ = iVar16;
            if ((BStack_74 == Left) && (MStack_70 == Pressed)) {
              ComponentBase::TakeFocus(&this->super_ComponentBase);
              bVar5 = true;
              if (*this->selected_ != iVar16) {
                *this->selected_ = iVar16;
                pTVar8 = (this->option_).address_;
                pTVar12 = &(this->option_).owned_;
                if (pTVar8 != (ToggleOption *)0x0) {
                  pTVar12 = pTVar8;
                }
                if ((pTVar12->on_change).super__Function_base._M_manager == (_Manager_type)0x0) {
                  std::__throw_bad_function_call();
                }
                (*(pTVar12->on_change)._M_invoker)((_Any_data *)&pTVar12->on_change);
              }
              goto LAB_0014c758;
            }
          }
          lVar17 = lVar17 + 1;
          pBVar14 = (this->boxes_).super__Vector_base<ftxui::Box,_std::allocator<ftxui::Box>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar18 = lVar18 + 0x10;
        } while (lVar17 < (int)((ulong)((long)(this->boxes_).
                                              super__Vector_base<ftxui::Box,_std::allocator<ftxui::Box>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)pBVar14) >> 4));
      }
    }
    bVar5 = false;
LAB_0014c758:
    if (local_60[0] == local_50) {
      return bVar5;
    }
    operator_delete(local_60[0],local_50[0] + 1);
    return bVar5;
  }
  iVar16 = *this->selected_;
  bVar5 = Event::operator==(event,(Event *)Event::ArrowLeft);
  if (bVar5) {
LAB_0014c843:
    *this->selected_ = *this->selected_ + -1;
  }
  else {
    Event::Character(&local_b8,'h');
    _Var4._M_p = local_b8.input_._M_dataplus._M_p;
    pCVar3 = (ComponentBase *)(event->input_)._M_string_length;
    if (pCVar3 == (ComponentBase *)local_b8.input_._M_string_length) {
      if (pCVar3 == (ComponentBase *)0x0) {
        bVar5 = true;
      }
      else {
        iVar6 = bcmp((event->input_)._M_dataplus._M_p,local_b8.input_._M_dataplus._M_p,
                     (size_t)pCVar3);
        bVar5 = iVar6 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if (_Var4._M_p != (pointer)((long)&local_b8 + 0x28U)) {
      operator_delete(_Var4._M_p,local_b8.input_.field_2._M_allocated_capacity + 1);
    }
    if (bVar5) goto LAB_0014c843;
  }
  bVar5 = Event::operator==(event,(Event *)Event::ArrowRight);
  if (bVar5) {
LAB_0014c8c0:
    *this->selected_ = *this->selected_ + 1;
  }
  else {
    Event::Character(&local_b8,'l');
    pCVar3 = (ComponentBase *)(event->input_)._M_string_length;
    if (pCVar3 == (ComponentBase *)local_b8.input_._M_string_length) {
      if (pCVar3 == (ComponentBase *)0x0) {
        bVar5 = true;
      }
      else {
        iVar6 = bcmp((event->input_)._M_dataplus._M_p,local_b8.input_._M_dataplus._M_p,
                     (size_t)pCVar3);
        bVar5 = iVar6 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if (local_b8.input_._M_dataplus._M_p != (pointer)((long)&local_b8 + 0x28U)) {
      operator_delete(local_b8.input_._M_dataplus._M_p,
                      local_b8.input_.field_2._M_allocated_capacity + 1);
    }
    if (bVar5) goto LAB_0014c8c0;
  }
  bVar5 = Event::operator==(event,(Event *)Event::Tab);
  if (bVar5) {
    pvVar10 = (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)(this->entries_).ref_;
    if (pvVar10 ==
        (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      pvVar10 = (this->entries_).ref_wide_;
    }
    if ((long)*(pointer *)(pvVar10 + 8) - *(long *)pvVar10 != 0) {
      *this->selected_ =
           (int)(((long)*this->selected_ + 1U) %
                (ulong)((long)*(pointer *)(pvVar10 + 8) - *(long *)pvVar10 >> 5));
    }
  }
  bVar5 = Event::operator==(event,(Event *)Event::TabReverse);
  pvVar10 = (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)(this->entries_).ref_;
  if (bVar5) {
    pvVar11 = pvVar10;
    if (pvVar10 ==
        (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      pvVar11 = (this->entries_).ref_wide_;
    }
    piVar13 = this->selected_;
    if ((long)*(pointer *)(pvVar11 + 8) - *(long *)pvVar11 != 0) {
      uVar15 = (long)*(pointer *)(pvVar11 + 8) - *(long *)pvVar11 >> 5;
      *piVar13 = (int)((((long)*piVar13 + uVar15) - 1) % uVar15);
    }
  }
  else {
    piVar13 = this->selected_;
  }
  if (pvVar10 ==
      (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
       *)0x0) {
    pvVar10 = (this->entries_).ref_wide_;
  }
  iVar6 = (int)((ulong)((long)*(pointer *)(pvVar10 + 8) - *(long *)pvVar10) >> 5) + -1;
  if (*piVar13 < iVar6) {
    iVar6 = *piVar13;
  }
  iVar7 = 0;
  if (0 < iVar6) {
    iVar7 = iVar6;
  }
  *piVar13 = iVar7;
  if (iVar16 == iVar7) {
    bVar5 = Event::operator==(event,(Event *)Event::Return);
    if (!bVar5) {
      return false;
    }
    pTVar8 = (this->option_).address_;
    pTVar12 = &(this->option_).owned_;
    if (pTVar8 != (ToggleOption *)0x0) {
      pTVar12 = pTVar8;
    }
    if ((pTVar12->on_enter).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0014ca11:
      std::__throw_bad_function_call();
    }
    (*(pTVar12->on_enter)._M_invoker)((_Any_data *)&pTVar12->on_enter);
  }
  else {
    pTVar8 = (this->option_).address_;
    pTVar12 = &(this->option_).owned_;
    if (pTVar8 != (ToggleOption *)0x0) {
      pTVar12 = pTVar8;
    }
    pRVar2 = (Ref<int> *)(pTVar12->focused_entry).address_;
    pRVar9 = &pTVar12->focused_entry;
    if (pRVar2 != (Ref<int> *)0x0) {
      pRVar9 = pRVar2;
    }
    pRVar9->owned_ = iVar7;
    if ((pTVar12->on_change).super__Function_base._M_manager == (_Manager_type)0x0)
    goto LAB_0014ca11;
    (*(pTVar12->on_change)._M_invoker)((_Any_data *)&pTVar12->on_change);
  }
  return true;
}

Assistant:

bool OnEvent(Event event) override {
    if (event.is_mouse())
      return OnMouseEvent(event);

    int old_selected = *selected_;
    if (event == Event::ArrowLeft || event == Event::Character('h'))
      (*selected_)--;
    if (event == Event::ArrowRight || event == Event::Character('l'))
      (*selected_)++;
    if (event == Event::Tab && entries_.size())
      *selected_ = (*selected_ + 1) % entries_.size();
    if (event == Event::TabReverse && entries_.size())
      *selected_ = (*selected_ + entries_.size() - 1) % entries_.size();

    *selected_ = std::max(0, std::min(int(entries_.size()) - 1, *selected_));

    if (old_selected != *selected_) {
      focused_entry() = *selected_;
      option_->on_change();
      return true;
    }

    if (event == Event::Return) {
      option_->on_enter();
      return true;
    }

    return false;
  }